

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

value * __thiscall
mjs::anon_unknown_35::unescape
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  runtime_error *this_00;
  size_t sVar1;
  gc_heap_ptr<mjs::global_object> *pgVar2;
  wchar_t wVar3;
  wstring res;
  gc_heap_ptr_untyped local_80;
  wchar_t *local_70;
  size_t local_68;
  wchar_t local_60;
  undefined4 uStack_5c;
  anon_unknown_35 *local_50;
  value *local_48;
  wstring_view local_40;
  
  sVar1 = s._M_len;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = L'\0';
  if (global != (gc_heap_ptr<mjs::global_object> *)0x0) {
    pgVar2 = (gc_heap_ptr<mjs::global_object> *)0x0;
    local_50 = this;
    local_48 = __return_storage_ptr__;
    do {
      wVar3 = (wchar_t)&local_70;
      if (*(int *)(sVar1 + (long)pgVar2 * 4) == 0x25) {
        if (global < (gc_heap_ptr<mjs::global_object> *)
                     ((long)&(pgVar2->super_gc_heap_ptr_untyped).heap_ + 3U)) {
LAB_0013c6f4:
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Invalid string in unescape");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (*(int *)(sVar1 + 4 + (long)pgVar2 * 4) == 0x75) {
          if (global < (gc_heap_ptr<mjs::global_object> *)
                       ((long)&(pgVar2->super_gc_heap_ptr_untyped).heap_ + 6U)) goto LAB_0013c6f4;
          get_hex_value4((wchar_t *)(sVar1 + 8 + (long)pgVar2 * 4));
          std::__cxx11::wstring::push_back(wVar3);
          pgVar2 = (gc_heap_ptr<mjs::global_object> *)
                   ((long)&(pgVar2->super_gc_heap_ptr_untyped).heap_ + 5);
        }
        else {
          get_hex_value2((wchar_t *)((long)pgVar2 * 4 + sVar1 + 4));
          std::__cxx11::wstring::push_back(wVar3);
          pgVar2 = (gc_heap_ptr<mjs::global_object> *)
                   ((long)&(pgVar2->super_gc_heap_ptr_untyped).heap_ + 2);
        }
      }
      else {
        std::__cxx11::wstring::push_back(wVar3);
      }
      pgVar2 = (gc_heap_ptr<mjs::global_object> *)
               ((long)&(pgVar2->super_gc_heap_ptr_untyped).heap_ + 1);
      this = local_50;
      __return_storage_ptr__ = local_48;
    } while (pgVar2 < global);
  }
  local_40._M_len = local_68;
  local_40._M_str = local_70;
  string::string((string *)&local_80,*(gc_heap **)this,&local_40);
  __return_storage_ptr__->type_ = string;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = local_80.heap_;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_80.pos_;
  if (local_80.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_80.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT44(uStack_5c,local_60) * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

value unescape(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wstring res;
    for (size_t i = 0; i < s.length(); ++i) {
        if (s[i] != '%') {
            res.push_back(s[i]);
            continue;
        }
        ++i;
        if (i + 2 > s.length() || (s[i] == 'u' && i + 5 > s.length())) {
            throw std::runtime_error("Invalid string in unescape");
        }
        if (s[i] == 'u') {
            res.push_back(static_cast<wchar_t>(get_hex_value4(&s[i+1])));
            i += 4;
        } else {
            res.push_back(static_cast<wchar_t>(get_hex_value2(&s[i])));
            i += 1;
        }
    }
    return value{string{global.heap(), res}};
}